

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GhostTorsion.cpp
# Opt level: O1

void __thiscall
OpenMD::GhostTorsion::calcForce(GhostTorsion *this,RealType *angle,bool doParticlePot)

{
  RealType *pRVar1;
  pointer ppAVar2;
  Atom *this_00;
  Atom *pAVar3;
  TorsionType *pTVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  DataStoragePointer DVar7;
  Snapshot *pSVar8;
  DataStoragePointer DVar9;
  Snapshot *pSVar10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  double dVar16;
  uint i;
  long lVar17;
  double *pdVar18;
  long lVar19;
  double *pdVar20;
  uint i_18;
  long lVar21;
  uint i_21;
  uint i_20;
  long lVar22;
  double (*__return_storage_ptr__) [3];
  uint i_22;
  uint i_23;
  long lVar23;
  double tmp;
  double tmp_1;
  Vector<double,_3U> v;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result_18;
  Vector<double,_3U> result_16;
  Vector<double,_3U> result;
  RealType dVdcosPhi;
  Vector<double,_3U> result_12;
  Vector<double,_3U> result_19;
  Vector3<double> result_4;
  undefined1 local_298 [16];
  double local_288;
  double local_278 [4];
  double local_258 [4];
  double local_238;
  double local_230;
  double local_228 [4];
  double local_208 [4];
  Vector3d local_1e8;
  double local_1c8 [10];
  double local_178;
  double local_170 [5];
  Vector3d local_148;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [10];
  double local_68 [4];
  double local_48 [3];
  
  ppAVar2 = (this->super_Torsion).super_ShortRangeInteraction.atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = ppAVar2[2];
  pAVar3 = *ppAVar2;
  lVar19 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_48[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar19 * 0x18);
  pdVar18 = (double *)(lVar17 + lVar19 * 0x18);
  local_48[0] = *pdVar18;
  local_48[1] = pdVar18[1];
  pAVar3 = ppAVar2[1];
  lVar19 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_d8[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar19 * 0x18);
  pdVar18 = (double *)(lVar17 + lVar19 * 0x18);
  local_d8[0] = *pdVar18;
  local_d8[1] = pdVar18[1];
  lVar19 = (long)(this_00->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData
                            ).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (this_00->super_StuntDouble).storage_);
  local_68[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar19 * 0x18);
  pdVar18 = (double *)(lVar17 + lVar19 * 0x18);
  local_68[0] = *pdVar18;
  local_68[1] = pdVar18[1];
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  lVar17 = 0;
  do {
    local_1c8[lVar17] = local_48[lVar17] - local_d8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_148.super_Vector<double,_3U>.data_[2] = local_1c8[2];
  local_148.super_Vector<double,_3U>.data_[0] = local_1c8[0];
  local_148.super_Vector<double,_3U>.data_[1] = local_1c8[1];
  Snapshot::wrapVector
            (((this->super_Torsion).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             &local_148);
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  lVar17 = 0;
  do {
    local_1c8[lVar17] = local_d8[lVar17] - local_68[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  pdVar18 = local_1c8;
  local_1e8.super_Vector<double,_3U>.data_[2] = local_1c8[2];
  local_1e8.super_Vector<double,_3U>.data_[0] = local_1c8[0];
  local_1e8.super_Vector<double,_3U>.data_[1] = local_1c8[1];
  Snapshot::wrapVector
            (((this->super_Torsion).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             &local_1e8);
  __return_storage_ptr__ = (double (*) [3])local_b8;
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this_00->super_StuntDouble);
  local_1c8[6] = 0.0;
  local_1c8[7] = 0.0;
  local_1c8[4] = 0.0;
  local_1c8[5] = 0.0;
  local_1c8[2] = 0.0;
  local_1c8[3] = 0.0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[8] = 0.0;
  lVar17 = 0;
  do {
    lVar19 = 0;
    pdVar20 = pdVar18;
    do {
      *pdVar20 = (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                 super_RectMatrix<double,_3U,_3U>).data_[0][lVar19];
      lVar19 = lVar19 + 1;
      pdVar20 = pdVar20 + 3;
    } while (lVar19 != 3);
    lVar17 = lVar17 + 1;
    pdVar18 = pdVar18 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar17 != 3);
  local_298 = ZEXT816(0);
  local_288 = 0.0;
  pdVar18 = local_1c8 + 2;
  lVar17 = 0;
  do {
    *(double *)(local_298 + lVar17 * 8) = *pdVar18;
    lVar17 = lVar17 + 1;
    pdVar18 = pdVar18 + 3;
  } while (lVar17 != 3);
  local_1c8[0] = local_1e8.super_Vector<double,_3U>.data_[2] *
                 local_148.super_Vector<double,_3U>.data_[1] -
                 local_148.super_Vector<double,_3U>.data_[2] *
                 local_1e8.super_Vector<double,_3U>.data_[1];
  local_1c8[1] = local_1e8.super_Vector<double,_3U>.data_[0] *
                 local_148.super_Vector<double,_3U>.data_[2] -
                 local_148.super_Vector<double,_3U>.data_[0] *
                 local_1e8.super_Vector<double,_3U>.data_[2];
  local_1c8[2] = local_148.super_Vector<double,_3U>.data_[0] *
                 local_1e8.super_Vector<double,_3U>.data_[1] -
                 local_1e8.super_Vector<double,_3U>.data_[0] *
                 local_148.super_Vector<double,_3U>.data_[1];
  local_230 = 0.0;
  lVar17 = 0;
  do {
    local_230 = local_230 + local_1c8[lVar17] * local_1c8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_108 = (double)local_298._0_8_;
  uStack_100 = 0;
  local_118 = (double)local_298._8_8_;
  dStack_110 = local_288;
  if (local_230 < 0.0) {
    local_230 = sqrt(local_230);
  }
  else {
    local_230 = SQRT(local_230);
  }
  local_178 = 0.0;
  local_128 = dStack_110;
  dStack_120 = local_108;
  local_b8[0] = local_1e8.super_Vector<double,_3U>.data_[1] * dStack_110 -
                local_1e8.super_Vector<double,_3U>.data_[2] * local_118;
  local_b8[1] = local_1e8.super_Vector<double,_3U>.data_[2] * local_108 -
                local_1e8.super_Vector<double,_3U>.data_[0] * dStack_110;
  local_b8[2] = local_1e8.super_Vector<double,_3U>.data_[0] * local_118 -
                local_108 * local_1e8.super_Vector<double,_3U>.data_[1];
  lVar17 = 0;
  do {
    local_178 = local_178 + local_b8[lVar17] * local_b8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (local_178 < 0.0) {
    local_178 = sqrt(local_178);
  }
  else {
    local_178 = SQRT(local_178);
  }
  if (1e-06 <= local_230 * local_178) {
    dVar11 = 0.0;
    lVar17 = 0;
    do {
      dVar11 = dVar11 + local_1c8[lVar17] * local_1c8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar17 = 0;
    do {
      local_1c8[lVar17] = local_1c8[lVar17] / dVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dVar11 = 0.0;
    lVar17 = 0;
    do {
      dVar11 = dVar11 + local_b8[lVar17] * local_b8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar17 = 0;
    do {
      local_b8[lVar17] = local_b8[lVar17] / dVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_238 = 0.0;
    lVar17 = 0;
    do {
      local_238 = local_238 + local_1c8[lVar17] * local_b8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    pTVar4 = (this->super_Torsion).torsionType_;
    pRVar1 = &(this->super_Torsion).potential_;
    (*pTVar4->_vptr_TorsionType[2])(pTVar4,pRVar1,local_170);
    local_278[0] = 0.0;
    local_278[1] = 0.0;
    local_278[2] = 0.0;
    lVar17 = 0;
    do {
      local_278[lVar17] = local_1c8[lVar17] * local_238;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_258[0] = 0.0;
    local_258[1] = 0.0;
    local_258[2] = 0.0;
    lVar17 = 0;
    do {
      local_258[lVar17] = local_278[lVar17] - local_b8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_298 = ZEXT816(0);
    local_288 = 0.0;
    lVar17 = 0;
    do {
      *(double *)(local_298 + lVar17 * 8) = local_258[lVar17] / local_230;
      dVar11 = local_288;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    uVar12 = local_298._0_8_;
    uVar14 = local_298._8_8_;
    local_278[0] = 0.0;
    local_278[1] = 0.0;
    local_278[2] = 0.0;
    lVar17 = 0;
    do {
      local_278[lVar17] = local_b8[lVar17] * local_238;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_258[0] = 0.0;
    local_258[1] = 0.0;
    local_258[2] = 0.0;
    lVar17 = 0;
    do {
      local_258[lVar17] = local_278[lVar17] - local_1c8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_298 = ZEXT816(0);
    local_288 = 0.0;
    lVar17 = 0;
    do {
      *(double *)(local_298 + lVar17 * 8) = local_258[lVar17] / local_178;
      dVar16 = local_288;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    uVar13 = local_298._0_8_;
    uVar15 = local_298._8_8_;
    local_298._0_8_ =
         local_1e8.super_Vector<double,_3U>.data_[1] * dVar11 -
         (double)uVar14 * local_1e8.super_Vector<double,_3U>.data_[2];
    local_298._8_8_ =
         local_1e8.super_Vector<double,_3U>.data_[2] * (double)uVar12 -
         dVar11 * local_1e8.super_Vector<double,_3U>.data_[0];
    local_288 = local_1e8.super_Vector<double,_3U>.data_[0] * (double)uVar14 -
                (double)uVar12 * local_1e8.super_Vector<double,_3U>.data_[1];
    local_170[1] = 0.0;
    local_170[2] = 0.0;
    local_170[3] = 0.0;
    lVar17 = 0;
    do {
      local_170[lVar17 + 1] = *(double *)(local_298 + lVar17 * 8) * local_170[0];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_258[0] = local_118 * dVar16 - (double)uVar15 * local_128;
    local_258[1] = dStack_110 * (double)uVar13 - dVar16 * dStack_120;
    local_258[2] = local_108 * (double)uVar15 - (double)uVar13 * local_118;
    local_278[0] = dVar11 * local_148.super_Vector<double,_3U>.data_[1] -
                   (double)uVar14 * local_148.super_Vector<double,_3U>.data_[2];
    local_278[1] = (double)uVar12 * local_148.super_Vector<double,_3U>.data_[2] -
                   dVar11 * local_148.super_Vector<double,_3U>.data_[0];
    local_278[2] = (double)uVar14 * local_148.super_Vector<double,_3U>.data_[0] -
                   (double)uVar12 * local_148.super_Vector<double,_3U>.data_[1];
    local_298 = ZEXT816(0);
    local_288 = 0.0;
    lVar17 = 0;
    do {
      *(double *)(local_298 + lVar17 * 8) = local_258[lVar17] - local_278[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_208[0] = 0.0;
    local_208[1] = 0.0;
    local_208[2] = 0.0;
    lVar17 = 0;
    do {
      local_208[lVar17] = *(double *)(local_298 + lVar17 * 8) * local_170[0];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_298._8_8_ =
         dVar16 * local_1e8.super_Vector<double,_3U>.data_[0] -
         local_1e8.super_Vector<double,_3U>.data_[2] * (double)uVar13;
    local_298._0_8_ =
         (double)uVar15 * local_1e8.super_Vector<double,_3U>.data_[2] -
         local_1e8.super_Vector<double,_3U>.data_[1] * dVar16;
    local_288 = (double)uVar13 * local_1e8.super_Vector<double,_3U>.data_[1] -
                local_1e8.super_Vector<double,_3U>.data_[0] * (double)uVar15;
    local_228[0] = 0.0;
    local_228[1] = 0.0;
    local_228[2] = 0.0;
    lVar17 = 0;
    do {
      local_228[lVar17] = *(double *)(local_298 + lVar17 * 8) * local_170[0];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    ppAVar2 = (this->super_Torsion).super_ShortRangeInteraction.atoms_.
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar3 = *ppAVar2;
    DVar5 = (pAVar3->super_StuntDouble).storage_;
    pSVar6 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar17 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar19 = lVar17 * 0x18 +
             *(long *)((long)&(pSVar6->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar5);
    lVar21 = 0;
    do {
      *(double *)(lVar19 + lVar21 * 8) = local_170[lVar21 + 1] + *(double *)(lVar19 + lVar21 * 8);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    pAVar3 = ppAVar2[1];
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
    lVar19 = 0;
    do {
      local_f8[lVar19] = local_208[lVar19] - local_170[lVar19 + 1];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    DVar7 = (pAVar3->super_StuntDouble).storage_;
    pSVar8 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar19 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar21 = lVar19 * 0x18 +
             *(long *)((long)&(pSVar8->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar7);
    lVar22 = 0;
    do {
      *(double *)(lVar21 + lVar22 * 8) = local_f8[lVar22] + *(double *)(lVar21 + lVar22 * 8);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar21 = 0;
    do {
      local_208[lVar21] = -local_208[lVar21];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    DVar9 = (this_00->super_StuntDouble).storage_;
    pSVar10 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar21 = (long)(this_00->super_StuntDouble).localIndex_;
    lVar23 = *(long *)((long)&(pSVar10->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar9) + lVar21 * 0x18;
    lVar22 = 0;
    do {
      *(double *)(lVar23 + lVar22 * 8) = local_208[lVar22] + *(double *)(lVar23 + lVar22 * 8);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      local_228[lVar22] = -local_228[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    dVar11 = dStack_110 * local_228[0] - dStack_120 * local_228[2];
    local_298._8_4_ = SUB84(dVar11,0);
    local_298._0_8_ = local_118 * local_228[2] - local_128 * local_228[1];
    local_298._12_4_ = (int)((ulong)dVar11 >> 0x20);
    local_288 = local_108 * local_228[1] - local_118 * local_228[0];
    lVar22 = lVar21 * 0x18 +
             *(long *)((long)&(pSVar10->atomData).torque.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar9);
    lVar23 = 0;
    do {
      *(double *)(lVar22 + lVar23 * 8) =
           *(double *)(local_298 + lVar23 * 8) + *(double *)(lVar22 + lVar23 * 8);
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    if (doParticlePot) {
      lVar22 = *(long *)((long)&(pSVar6->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar5);
      *(double *)(lVar22 + lVar17 * 8) = *pRVar1 + *(double *)(lVar22 + lVar17 * 8);
      lVar17 = *(long *)((long)&(pSVar8->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar7);
      *(double *)(lVar17 + lVar19 * 8) = *pRVar1 + *(double *)(lVar17 + lVar19 * 8);
      lVar17 = *(long *)((long)&(pSVar10->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar9);
      *(double *)(lVar17 + lVar21 * 8) = *pRVar1 + *(double *)(lVar17 + lVar21 * 8);
    }
    dVar11 = acos(local_238);
    *angle = (dVar11 / 3.141592653589793) * 180.0;
  }
  return;
}

Assistant:

void GhostTorsion::calcForce(RealType& angle, bool doParticlePot) {
    DirectionalAtom* ghostAtom = static_cast<DirectionalAtom*>(atoms_[2]);

    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = ghostAtom->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    Vector3d r32 = pos2 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r32);
    Vector3d r43 = ghostAtom->getA().transpose().getColumn(2);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r21, r32);
    RealType rA = A.length();
    Vector3d B  = cross(r32, r43);
    RealType rB = B.length();

    /*
     If either of the two cross product vectors is tiny, that means
     the three atoms involved are colinear, and the torsion angle is
     going to be undefined.  The easiest check for this problem is
     to use the product of the two lengths.
  */
    if (rA * rB < OpenMD::epsilon) return;

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);

    RealType dVdcosPhi;
    torsionType_->calcForce(cos_phi, potential_, dVdcosPhi);

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    Vector3d f1 = dVdcosPhi * cross(r32, dcosdA);
    Vector3d f2 = dVdcosPhi * (cross(r43, dcosdB) - cross(r21, dcosdA));
    Vector3d f3 = dVdcosPhi * cross(dcosdB, r32);

    atoms_[0]->addFrc(f1);
    atoms_[1]->addFrc(f2 - f1);

    ghostAtom->addFrc(-f2);

    f3.negate();
    ghostAtom->addTrq(cross(r43, f3));

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      ghostAtom->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }